

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

long mi_option_get(mi_option_t option)

{
  mi_option_desc_t *pmVar1;
  mi_option_t option_00;
  bool bVar2;
  _Bool _Var3;
  char cVar4;
  size_t sVar5;
  char *pcVar6;
  ulong value;
  ulong uVar7;
  size_t i;
  size_t sVar8;
  char *end;
  char buf [65];
  char s [65];
  
  if (mi_option_generic_collect < option) {
    return 0;
  }
  pmVar1 = options + option;
  if (options[option].init != UNINIT) goto LAB_0047d472;
  _mi_strlcpy(buf,"mimalloc_",0x41);
  _mi_strlcat(buf,options[option].name,0x41);
  _Var3 = _mi_getenv(buf,s,0x41);
  if (!_Var3) {
    if (options[option].legacy_name != (char *)0x0) {
      _mi_strlcpy(buf,"mimalloc_",0x41);
      _mi_strlcat(buf,options[option].legacy_name,0x41);
      _Var3 = _mi_getenv(buf,s,0x41);
      if (_Var3) {
        _mi_warning_message("environment option \"mimalloc_%s\" is deprecated -- use \"mimalloc_%s\" instead.\n"
                            ,options[option].legacy_name,options[option].name);
        goto LAB_0047d51f;
      }
    }
    _Var3 = _mi_preloading();
    if (!_Var3) {
      options[option].init = DEFAULTED;
    }
    goto LAB_0047d472;
  }
LAB_0047d51f:
  sVar5 = _mi_strnlen(s,0x40);
  for (sVar8 = 0; sVar5 != sVar8; sVar8 = sVar8 + 1) {
    cVar4 = _mi_toupper(s[sVar8]);
    buf[sVar8] = cVar4;
  }
  buf[sVar5] = '\0';
  if ((buf[0] == '\0') || (pcVar6 = strstr("1;TRUE;YES;ON",buf), pcVar6 != (char *)0x0)) {
    pmVar1->value = 1;
  }
  else {
    pcVar6 = strstr("0;FALSE;NO;OFF",buf);
    if (pcVar6 == (char *)0x0) {
      end = buf;
      value = strtol(buf,&end,10);
      option_00 = options[option].option;
      if ((option_00 == mi_option_reserve_os_memory) || (option_00 == mi_option_arena_reserve)) {
        uVar7 = 0;
        if (0 < (long)value) {
          uVar7 = value;
        }
        cVar4 = *end;
        if (cVar4 == 'G') {
          bVar2 = 0xfffffffffff < (long)value;
          value = uVar7 << 0x14;
LAB_0047d666:
          end = end + 1;
          cVar4 = *end;
        }
        else {
          if (cVar4 == 'T') {
            bVar2 = 0x3ffffffff < (long)value;
            value = uVar7 << 0x1e;
            goto LAB_0047d666;
          }
          if (cVar4 == 'M') {
            bVar2 = 0x3fffffffffffff < (long)value;
            value = uVar7 << 10;
            goto LAB_0047d666;
          }
          if (cVar4 == 'K') {
            bVar2 = false;
            value = uVar7;
            goto LAB_0047d666;
          }
          value = uVar7 + 0x3ff >> 10;
          bVar2 = false;
        }
        if (cVar4 == 'B') {
          end = end + 1;
        }
        else if ((cVar4 == 'I') && (end[1] == 'B')) {
          end = end + 2;
        }
        if (0xfffffffe0000 < value) {
          value = 0x3fffffff80;
        }
        if (bVar2) {
          value = 0x3fffffff80;
        }
      }
      if (*end == '\0') {
        mi_option_set(option_00,value);
      }
      else {
        options[option].init = DEFAULTED;
        if ((option_00 == mi_option_verbose) && (pmVar1->value == 0)) {
          pmVar1->value = 1;
          _mi_warning_message("environment option mimalloc_%s has an invalid value.\n",
                              options[option].name);
          pmVar1->value = 0;
        }
        else {
          _mi_warning_message("environment option mimalloc_%s has an invalid value.\n",
                              options[option].name);
        }
      }
      goto LAB_0047d472;
    }
    pmVar1->value = 0;
  }
  options[option].init = INITIALIZED;
LAB_0047d472:
  return pmVar1->value;
}

Assistant:

mi_decl_nodiscard long mi_option_get(mi_option_t option) {
  mi_assert(option >= 0 && option < _mi_option_last);
  if (option < 0 || option >= _mi_option_last) return 0;
  mi_option_desc_t* desc = &options[option];
  mi_assert(desc->option == option);  // index should match the option
  if mi_unlikely(desc->init == UNINIT) {
    mi_option_init(desc);
  }